

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::EndValue(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
           *this,Context *context)

{
  uint64_t *puVar1;
  uint uVar2;
  bool bVar3;
  byte bVar4;
  undefined4 extraout_var;
  ulong uVar6;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  Ch *pCVar7;
  ulong uVar8;
  ISchemaValidator **ppIVar9;
  ErrorHandlerType *pEVar10;
  uint uVar11;
  ulong uVar12;
  int iVar5;
  
  uVar12 = (ulong)context->patternPropertiesValidatorCount;
  if (uVar12 != 0) {
    if (context->objectPatternValidatorType == kPatternValidatorOnly) {
      bVar4 = 0;
    }
    else {
      uVar12 = (ulong)(context->patternPropertiesValidatorCount - 1);
      iVar5 = (*context->patternPropertiesValidators[uVar12]->_vptr_ISchemaValidator[2])();
      bVar4 = (byte)iVar5;
    }
    uVar6 = 0;
    do {
      uVar8 = uVar6;
      if (uVar12 == uVar8) break;
      iVar5 = (*context->patternPropertiesValidators[uVar8]->_vptr_ISchemaValidator[2])();
      uVar6 = uVar8 + 1;
    } while ((char)iVar5 != '\0');
    if (context->objectPatternValidatorType == kPatternValidatorWithProperty) {
      if ((bVar4 & uVar12 <= uVar8) == 0) {
LAB_0012809f:
        pEVar10 = context->error_handler;
        ppIVar9 = context->patternPropertiesValidators;
        uVar12 = (ulong)((int)uVar12 + 1);
LAB_001280aa:
        (*pEVar10->_vptr_IValidationErrorHandler[0x17])(pEVar10,ppIVar9,uVar12);
        context->invalidCode = kValidateErrorPatternProperties;
        this_00 = GetPatternPropertiesString();
        goto LAB_0012819c;
      }
    }
    else if (context->objectPatternValidatorType == kPatternValidatorOnly) {
      if (uVar8 < uVar12) {
        pEVar10 = context->error_handler;
        ppIVar9 = context->patternPropertiesValidators;
        goto LAB_001280aa;
      }
    }
    else if (bVar4 == 0 && uVar8 < uVar12) goto LAB_0012809f;
  }
  if ((this->enum_ != (uint64_t *)0x0) && (context->hasher != (void *)0x0)) {
    iVar5 = (*context->factory->_vptr_ISchemaStateFactory[5])();
    uVar12 = 0;
    do {
      if (this->enumCount_ == uVar12) {
        (*context->error_handler->_vptr_IValidationErrorHandler[0x1f])(context->error_handler,0x13);
        context->invalidCode = kValidateErrorEnum;
        this_00 = GetEnumString();
        goto LAB_0012819c;
      }
      puVar1 = this->enum_ + uVar12;
      uVar12 = uVar12 + 1;
    } while (*puVar1 != CONCAT44(extraout_var,iVar5));
  }
  if (context->validatorCount == 0) {
    return true;
  }
  if ((this->allOf_).schemas == (SchemaType **)0x0) {
LAB_00127fe5:
    if ((this->anyOf_).schemas != (SchemaType **)0x0) {
      uVar12 = (ulong)(this->anyOf_).begin;
      do {
        uVar11 = (this->anyOf_).begin;
        if (uVar11 + (this->anyOf_).count <= uVar12) {
          (*context->error_handler->_vptr_IValidationErrorHandler[0x24])
                    (context->error_handler,context->validators + uVar11);
          context->invalidCode = kValidateErrorAnyOf;
          this_00 = GetAnyOfString();
          goto LAB_0012819c;
        }
        iVar5 = (*context->validators[uVar12]->_vptr_ISchemaValidator[2])();
        uVar12 = uVar12 + 1;
      } while ((char)iVar5 == '\0');
    }
    if ((this->oneOf_).schemas != (SchemaType **)0x0) {
      bVar3 = false;
      uVar11 = 0;
      uVar6 = (ulong)(this->oneOf_).begin;
      for (uVar12 = uVar6; uVar12 < (this->oneOf_).count + (int)uVar6; uVar12 = uVar12 + 1) {
        iVar5 = (*context->validators[uVar12]->_vptr_ISchemaValidator[2])();
        if ((char)iVar5 == '\0') {
          uVar2 = (this->oneOf_).begin;
        }
        else {
          if (bVar3) {
            (*context->error_handler->_vptr_IValidationErrorHandler[0x26])
                      (context->error_handler,(ulong)uVar11,
                       (ulong)((int)uVar12 - (this->oneOf_).begin));
            context->invalidCode = kValidateErrorOneOfMatch;
            goto LAB_00128197;
          }
          uVar2 = (this->oneOf_).begin;
          uVar11 = (int)uVar12 - uVar2;
          bVar3 = true;
        }
        uVar6 = (ulong)uVar2;
      }
      if (!bVar3) {
        (*context->error_handler->_vptr_IValidationErrorHandler[0x25])
                  (context->error_handler,context->validators + uVar6);
        context->invalidCode = kValidateErrorOneOf;
LAB_00128197:
        this_00 = GetOneOfString();
        goto LAB_0012819c;
      }
    }
    if (this->not_ == (SchemaType *)0x0) {
      return true;
    }
    iVar5 = (*context->validators[this->notValidatorIndex_]->_vptr_ISchemaValidator[2])();
    if ((char)iVar5 == '\0') {
      return true;
    }
    (*context->error_handler->_vptr_IValidationErrorHandler[0x27])();
    context->invalidCode = kValidateErrorNot;
    this_00 = GetNotString();
  }
  else {
    uVar12 = (ulong)(this->allOf_).begin;
    do {
      if ((this->allOf_).count + (this->allOf_).begin <= uVar12) goto LAB_00127fe5;
      iVar5 = (*context->validators[uVar12]->_vptr_ISchemaValidator[2])();
      uVar12 = uVar12 + 1;
    } while ((char)iVar5 != '\0');
    (*context->error_handler->_vptr_IValidationErrorHandler[0x23])
              (context->error_handler,context->validators + (this->allOf_).begin,
               (ulong)(this->allOf_).count);
    context->invalidCode = kValidateErrorAllOf;
    this_00 = GetAllOfString();
  }
LAB_0012819c:
  pCVar7 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(this_00);
  context->invalidKeyword = pCVar7;
  return false;
}

Assistant:

RAPIDJSON_FORCEINLINE bool EndValue(Context& context) const {
        RAPIDJSON_SCHEMA_PRINT(Method, "Schema::EndValue");
        // Only check pattern properties if we have validators
        if (context.patternPropertiesValidatorCount > 0) {
            bool otherValid = false;
            SizeType count = context.patternPropertiesValidatorCount;
            if (context.objectPatternValidatorType != Context::kPatternValidatorOnly)
                otherValid = context.patternPropertiesValidators[--count]->IsValid();

            bool patternValid = true;
            for (SizeType i = 0; i < count; i++)
                if (!context.patternPropertiesValidators[i]->IsValid()) {
                    patternValid = false;
                    break;
                }

            if (context.objectPatternValidatorType == Context::kPatternValidatorOnly) {
                if (!patternValid) {
                    context.error_handler.PropertyViolations(context.patternPropertiesValidators, count);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorPatternProperties);
                }
            }
            else if (context.objectPatternValidatorType == Context::kPatternValidatorWithProperty) {
                if (!patternValid || !otherValid) {
                    context.error_handler.PropertyViolations(context.patternPropertiesValidators, count + 1);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorPatternProperties);
                }
            }
            else if (!patternValid && !otherValid) { // kPatternValidatorWithAdditionalProperty)
                context.error_handler.PropertyViolations(context.patternPropertiesValidators, count + 1);
                RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorPatternProperties);
            }
        }

        // For enums only check if we have a hasher
        if (enum_ && context.hasher) {
            const uint64_t h = context.factory.GetHashCode(context.hasher);
            for (SizeType i = 0; i < enumCount_; i++)
                if (enum_[i] == h)
                    goto foundEnum;
            context.error_handler.DisallowedValue(kValidateErrorEnum);
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorEnum);
            foundEnum:;
        }

        // Only check allOf etc if we have validators
        if (context.validatorCount > 0) {
            if (allOf_.schemas)
                for (SizeType i = allOf_.begin; i < allOf_.begin + allOf_.count; i++)
                    if (!context.validators[i]->IsValid()) {
                        context.error_handler.NotAllOf(&context.validators[allOf_.begin], allOf_.count);
                        RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorAllOf);
                    }

            if (anyOf_.schemas) {
                for (SizeType i = anyOf_.begin; i < anyOf_.begin + anyOf_.count; i++)
                    if (context.validators[i]->IsValid())
                        goto foundAny;
                context.error_handler.NoneOf(&context.validators[anyOf_.begin], anyOf_.count);
                RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorAnyOf);
                foundAny:;
            }

            if (oneOf_.schemas) {
                bool oneValid = false;
                SizeType firstMatch = 0;
                for (SizeType i = oneOf_.begin; i < oneOf_.begin + oneOf_.count; i++)
                    if (context.validators[i]->IsValid()) {
                        if (oneValid) {
                            context.error_handler.MultipleOneOf(firstMatch, i - oneOf_.begin);
                            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorOneOfMatch);
                        } else {
                            oneValid = true;
                            firstMatch = i - oneOf_.begin;
                        }
                    }
                if (!oneValid) {
                    context.error_handler.NotOneOf(&context.validators[oneOf_.begin], oneOf_.count);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorOneOf);
                }
            }

            if (not_ && context.validators[notValidatorIndex_]->IsValid()) {
                context.error_handler.Disallowed();
                RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorNot);
            }
        }

        return true;
    }